

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O0

int __thiscall BPTree::height(BPTree *this,Node *cursor)

{
  int iVar1;
  Node *cursor_local;
  BPTree *this_local;
  
  if ((cursor->IS_LEAF & 1U) == 0) {
    iVar1 = height(this,*cursor->ptr);
    this_local._4_4_ = iVar1 + 1;
  }
  else if ((cursor->IS_LEAF & 1U) == 1) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int height(Node* cursor){
        if(cursor->IS_LEAF==false){
            return height(cursor->ptr[0])+1;
        }
        else if(cursor->IS_LEAF==true){
            return 1;
        }
        else{
            return NULL;
        }
    }